

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

void __thiscall
AssemblyCode::CJumpLessCommand::CJumpLessCommand
          (CJumpLessCommand *this,CTemp *leftOperand,CTemp *rightOperand,string *label)

{
  AbstractJumpCommand::AbstractJumpCommand(&this->super_AbstractJumpCommand,label);
  (this->super_AbstractJumpCommand).super_AssemblyCommand._vptr_AssemblyCommand =
       (_func_int **)&PTR_GetIn_0017ce48;
  std::__cxx11::string::string((string *)&this->leftOperand,(string *)leftOperand);
  std::__cxx11::string::string((string *)&this->rightOperand,(string *)rightOperand);
  return;
}

Assistant:

AssemblyCode::CJumpLessCommand::CJumpLessCommand( const IRT::CTemp leftOperand, const IRT::CTemp rightOperand,
                                                  const std::string &label ) : AbstractJumpCommand( label ),
                                                                               leftOperand( leftOperand ),
                                                                               rightOperand( rightOperand ) { }